

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O2

void initializeContainerNetwork(Container *container)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  bool bVar1;
  Verbosity VVar2;
  int iVar3;
  sem_t *psVar4;
  sem_t *__sem;
  runtime_error *prVar5;
  long lVar6;
  undefined1 auVar7 [8];
  double __x;
  double __x_00;
  double __x_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  undefined1 local_298 [8];
  string suffix;
  string broadcast;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined1 local_178 [8];
  string containerIp;
  undefined1 local_150 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  vEthPair;
  string bridgeFilePath;
  string newNetworkNs;
  string command;
  undefined1 local_90 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator_type local_31;
  
  VVar2 = loguru::current_verbosity_cutoff();
  if (-1 < VVar2) {
    loguru::log(__x);
  }
  psVar4 = sem_open("/networkNsSemaphore",0);
  if (psVar4 == (sem_t *)0x0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_150,"/networkNsSemaphore",
               (allocator<char> *)(bridgeFilePath.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&suffix.field_2 + 8),"sem_open failed for ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
    std::runtime_error::runtime_error(prVar5,(string *)(suffix.field_2._M_local_buf + 8));
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __sem = sem_open("/networkInitSemaphore",0);
  if (__sem == (sem_t *)0x0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_150,"/networkInitSemaphore",
               (allocator<char> *)(bridgeFilePath.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&suffix.field_2 + 8),"sem_open failed for ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
    std::runtime_error::runtime_error(prVar5,(string *)(suffix.field_2._M_local_buf + 8));
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string
            ((string *)(bridgeFilePath.field_2._M_local_buf + 8),(string *)&container->id);
  std::__cxx11::string::substr((ulong)local_298,(ulong)&container->id);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                 "veth0@",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_298);
  containerIp.field_2._8_8_ = psVar4;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                 "veth1@",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_298);
  this = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)(&suffix.field_2._M_allocated_capacity + 1);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=(&container->vEthPair,this);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(this);
  std::__cxx11::string::~string((string *)local_178);
  std::__cxx11::string::~string((string *)local_150);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_150,&container->vEthPair);
  getContainerVEthIp_abi_cxx11_();
  if (containerIp._M_dataplus._M_p == (pointer)0x0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"Obtain IPv4 address for container: FAILED");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  VVar2 = loguru::current_verbosity_cutoff();
  if (-1 < VVar2) {
    loguru::log(__x_00);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&suffix.field_2 + 8),"ip netns add ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&bridgeFilePath.field_2 + 8));
  iVar3 = system((char *)suffix.field_2._8_8_);
  std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
  if (iVar3 == -1) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&vEthPair.second.field_2 + 8),"Create namespace ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&bridgeFilePath.field_2 + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&suffix.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&vEthPair.second.field_2 + 8),": FAILED");
    std::runtime_error::runtime_error(prVar5,(string *)(suffix.field_2._M_local_buf + 8));
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sem_post((sem_t *)containerIp.field_2._8_8_);
  sem_wait(__sem);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&newNetworkNs.field_2 + 8),"ip link add ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&vEthPair.second.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&newNetworkNs.field_2 + 8)," type veth peer name ");
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (&vEthPair.first.field_2._M_allocated_capacity + 1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&suffix.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&vEthPair.second.field_2 + 8),__rhs);
  std::operator+(&local_58,"ip link set ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_58," netns ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&broadcast.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&bridgeFilePath.field_2 + 8));
  std::operator+(&local_418,"ip link set ",__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&command.field_2 + 8),&local_418," master ");
  std::operator+(&local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&command.field_2 + 8),&BRIDGE_NAME_abi_cxx11_);
  std::operator+(&local_398,"ip netns exec ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&bridgeFilePath.field_2 + 8));
  std::operator+(&local_3b8,&local_398," ip addr add ");
  std::operator+(&local_3d8,&local_3b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
  std::operator+(&local_3f8,&local_3d8,"/24 dev ");
  std::operator+(&local_218,&local_3f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
  std::operator+(&local_338,"ip netns exec ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&bridgeFilePath.field_2 + 8));
  std::operator+(&local_358,&local_338," ip link set ");
  std::operator+(&local_378,&local_358,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
  std::operator+(&local_1f8,&local_378," up");
  std::operator+(&local_318,"ip netns exec ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&bridgeFilePath.field_2 + 8));
  std::operator+(&local_1d8,&local_318," ip link set lo up");
  std::operator+(&local_2f8,"ip link set ",__rhs);
  std::operator+(&local_1b8,&local_2f8," up");
  std::operator+(&local_2b8,"ip netns exec ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&bridgeFilePath.field_2 + 8));
  std::operator+(&local_2d8,&local_2b8," ip route add default via ");
  std::operator+(&local_198,&local_2d8,&BRIDGE_IP_abi_cxx11_);
  __l._M_len = 8;
  __l._M_array = (iterator)((long)&suffix.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_90,__l,&local_31);
  lVar6 = 0xe0;
  do {
    std::__cxx11::string::~string((string *)((long)&suffix.field_2 + lVar6 + 8));
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)(command.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string
            ((string *)
             &commands.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)(vEthPair.second.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(newNetworkNs.field_2._M_local_buf + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&suffix.field_2 + 8),"/sys/class/net/",&BRIDGE_NAME_abi_cxx11_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&vEthPair.second.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&suffix.field_2 + 8),"/bridge");
  std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)((long)&suffix.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&vEthPair.second.field_2 + 8),auto_format);
  bVar1 = std::filesystem::exists((path *)((long)&suffix.field_2 + 8));
  std::filesystem::__cxx11::path::~path((path *)((long)&suffix.field_2 + 8));
  auVar7 = local_90;
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(suffix.field_2._M_local_buf + 8),"iptables --policy FORWARD ACCEPT",
               (allocator<char> *)(newNetworkNs.field_2._M_local_buf + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_90,(const_iterator)auVar7,(value_type *)((long)&suffix.field_2 + 8));
    std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
    std::__cxx11::string::string
              ((string *)(suffix.field_2._M_local_buf + 8),(string *)&BRIDGE_IP_abi_cxx11_);
    std::__cxx11::string::pop_back();
    std::__cxx11::string::push_back((char)&suffix + '\x18');
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&command.field_2 + 8),"iptables -t nat -A POSTROUTING -s ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&suffix.field_2 + 8));
    std::operator+(&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&command.field_2 + 8),"/24 ! -o ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &commands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_58,
                   &BRIDGE_NAME_abi_cxx11_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&newNetworkNs.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &commands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage," -j MASQUERADE");
    std::__cxx11::string::~string
              ((string *)
               &commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)(command.field_2._M_local_buf + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_90,(const_iterator)local_90,(value_type *)((long)&newNetworkNs.field_2 + 8));
    auVar7 = local_90;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&command.field_2 + 8),"ip addr add ",&BRIDGE_IP_abi_cxx11_);
    std::operator+(&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&command.field_2 + 8),"/24 brd + dev ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &commands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_58,
                   &BRIDGE_NAME_abi_cxx11_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_90,(const_iterator)auVar7,
                     (value_type *)
                     &commands.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)(command.field_2._M_local_buf + 8));
    auVar7 = local_90;
    std::operator+(&local_58,"ip link set ",&BRIDGE_NAME_abi_cxx11_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &commands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_58," up");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_90,(const_iterator)auVar7,
                     (value_type *)
                     &commands.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_58);
    auVar7 = local_90;
    std::operator+(&local_58,"ip link add name ",&BRIDGE_NAME_abi_cxx11_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &commands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_58," type bridge");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_90,(const_iterator)auVar7,
                     (value_type *)
                     &commands.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)(newNetworkNs.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
    auVar7 = local_90;
  }
  while( true ) {
    if (auVar7 == (undefined1  [8])
                  commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      sem_post(__sem);
      VVar2 = loguru::current_verbosity_cutoff();
      if (-1 < VVar2) {
        loguru::log(__x_01);
      }
      std::__cxx11::string::~string((string *)(vEthPair.second.field_2._M_local_buf + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_90);
      std::__cxx11::string::~string((string *)local_178);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_150);
      std::__cxx11::string::~string((string *)local_298);
      std::__cxx11::string::~string((string *)(bridgeFilePath.field_2._M_local_buf + 8));
      return;
    }
    iVar3 = system((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar7)->
                   _M_dataplus)._M_p);
    if (iVar3 == -1) break;
    auVar7 = (undefined1  [8])((long)auVar7 + 0x20);
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&newNetworkNs.field_2 + 8),"Execute command ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar7);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&suffix.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&newNetworkNs.field_2 + 8),": FAILED");
  std::runtime_error::runtime_error(prVar5,(string *)(suffix.field_2._M_local_buf + 8));
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void initializeContainerNetwork(Container* container)
{
    LOG_F(INFO, "Initializing container network environment");
    try
    {
        auto* networkNsSemaphore = sem_open(NETWORK_NS_SEM_NAME, 0);
        if (networkNsSemaphore == SEM_FAILED)
            throw std::runtime_error("sem_open failed for " + std::string(NETWORK_NS_SEM_NAME));
        auto* networkInitSemaphore = sem_open(NETWORK_INIT_SEM_NAME, 0);
        if (networkInitSemaphore == SEM_FAILED)
            throw std::runtime_error("sem_open failed for " + std::string(NETWORK_INIT_SEM_NAME));

        std::string newNetworkNs = container->id;
        // Takes the first 9 characters of the container's ID as the suffix
        // for the names of the veth pair since a valid interface name contains
        // less than 16 characters
        std::string suffix = container->id.substr(0, 9);
        container->vEthPair = std::make_pair("veth0@" + suffix, "veth1@" + suffix);
        auto vEthPair = container->vEthPair;

        std::string containerIp = getContainerVEthIp();
        if (containerIp.empty())
            throw std::runtime_error("Obtain IPv4 address for container: FAILED");
        LOG_F(INFO, "Container IP: %s", containerIp.c_str());

        // Adds the container's ID as a new network namespace
        if (system(("ip netns add " + newNetworkNs).c_str()) == -1)
            throw std::runtime_error("Create namespace " + newNetworkNs + ": FAILED");
        // Unblocks the thread that is attempting to mount /var/run/netns/<new-network-ns>
        sem_post(networkNsSemaphore);
//        sem_post(sem_open(NETWORK_NS_SEM_NAME, 0));
        // Blocks itself until the container's registers its namespace in setUpNetworkNamespace()
        sem_wait(networkInitSemaphore);
//        sem_wait(sem_open(NETWORK_INIT_SEM_NAME, 0));
        std::vector<std::string> commands = {
                // Creates a veth pair
                "ip link add " +  vEthPair.first + " type veth peer name " + vEthPair.second,
                // Moves one end of the veth pair to the new namespace
                "ip link set " + vEthPair.first + " netns " + newNetworkNs,
                // Moves the other end of the veth pair to the bridge
                "ip link set " + vEthPair.second + " master " + BRIDGE_NAME,
                // Assigns an IPv4 address to the first interface in the veth pair
                "ip netns exec " + newNetworkNs + " ip addr add " + containerIp + "/24 dev " + vEthPair.first,
                // Ups veth0
                "ip netns exec " + newNetworkNs + " ip link set " + vEthPair.first + " up",
                // Ups the container's localhost
                "ip netns exec " + newNetworkNs + " ip link set lo up",
                // Ups veth1
                "ip link set " + vEthPair.second + " up",
                // Adds the bridge as the default gateway
                "ip netns exec " + newNetworkNs + " ip route add default via " + BRIDGE_IP
        };

        // Checks if the bridge 'kapsel' already exists
        std::string bridgeFilePath = "/sys/class/net/" + BRIDGE_NAME + "/bridge";
        if (!std::filesystem::exists(bridgeFilePath))
        {
            // Changes the policy on IP table
            // FIXME There might exist another solution
            // From: https://serverfault.com/questions/694889/cannot-ping-linux-network-namespace-within-the-same-subnet
            commands.insert(commands.begin(), "iptables --policy FORWARD ACCEPT");
            // Enable sending requests and getting responses to/from internet
            // From: https://dev.to/polarbit/how-docker-container-networking-works-mimic-it-using-linux-network-namespaces-9mj
            std::string broadcast = BRIDGE_IP;
            broadcast.pop_back();
            broadcast.push_back('1');
            std::string command = "iptables -t nat -A POSTROUTING -s " + broadcast + "/24 ! -o " + BRIDGE_NAME + " -j MASQUERADE";
            commands.insert(commands.begin(), command);
            // Assigns an IP address to the bridge
            commands.insert(commands.begin(), "ip addr add " + BRIDGE_IP + "/24 brd + dev " + BRIDGE_NAME);
            // Ups the bridge interface
            commands.insert(commands.begin(), "ip link set " + BRIDGE_NAME + " up");
            // Creates a network bridge
            commands.insert(commands.begin(), "ip link add name " + BRIDGE_NAME + " type bridge");
        }

        for (const auto& command : commands)
        {
            if (system(command.c_str()) == -1)
                throw std::runtime_error("Execute command " + command + ": FAILED");
        }

        sem_post(networkInitSemaphore);
//        sem_post(sem_open(NETWORK_NS_SEM_NAME, 0));
        LOG_F(INFO, "Initialize container network environment: SUCCESS");
    }
    catch (std::exception& ex)
    {
        LOG_F(ERROR, "Initialize container network environment: FAILED");
        LOG_F(ERROR, "%s", ex.what());
    }
}